

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

void __thiscall QToolBarLayout::updateGeomArray(QToolBarLayout *this)

{
  QToolBarItem *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Orientation OVar5;
  int iVar6;
  uint uVar7;
  Int IVar8;
  QToolBar *pQVar9;
  QStyle *pQVar10;
  int *piVar11;
  qsizetype qVar12;
  const_reference ppQVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference pQVar14;
  long *in_RDI;
  long in_FS_OFFSET;
  bool empty;
  QToolBarItem *item;
  int i;
  int count;
  Orientation o;
  int extensionExtent;
  int spacing;
  int handleExtent;
  QStyle *style;
  QToolBar *tb;
  QToolBarLayout *that;
  int s;
  Orientations exp;
  QSize hint;
  QSize min;
  QSize max;
  QList<QLayoutStruct> a;
  QMargins margins;
  QStyleOptionToolBar opt;
  int in_stack_fffffffffffffe58;
  Orientation in_stack_fffffffffffffe5c;
  PolicyFlag in_stack_fffffffffffffe60;
  Orientation in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  Orientation in_stack_fffffffffffffe74;
  int local_160;
  bool local_151;
  Orientation local_13c;
  int local_120;
  int local_11c;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_d4;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_d0;
  QFlagsStorageHelper<Qt::Orientation,_4> local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_bc;
  QFlagsStorageHelper<Qt::Orientation,_4> local_b8;
  int local_b4;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  long local_80;
  long local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 9) & 1) != 0) {
    QLayout::parentWidget((QLayout *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
    pQVar9 = qobject_cast<QToolBar*>((QObject *)0x6fd1e6);
    if (pQVar9 != (QToolBar *)0x0) {
      pQVar10 = QWidget::style((QWidget *)
                               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      memset(local_60,0xaa,0x58);
      QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)0x6fd237);
      (**(code **)(*(long *)&pQVar9->super_QWidget + 0x1a0))(pQVar9,local_60);
      bVar2 = movable((QToolBarLayout *)
                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      if (bVar2) {
        local_13c = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x35,local_60,pQVar9);
      }
      else {
        local_13c = 0;
      }
      local_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = (undefined1  [16])
                 QLayout::contentsMargins
                           ((QLayout *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                           );
      iVar3 = (**(code **)(*in_RDI + 0x60))();
      iVar4 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x39,local_60,pQVar9);
      OVar5 = QToolBar::orientation
                        ((QToolBar *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
      in_RDI[8] = local_78;
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
      in_RDI[7] = local_80;
      iVar6 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x35,local_60,pQVar9);
      piVar11 = rperp(in_stack_fffffffffffffe64,
                      (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      *piVar11 = iVar6;
      iVar6 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x35,local_60,pQVar9);
      piVar11 = rperp(in_stack_fffffffffffffe64,
                      (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      *piVar11 = iVar6;
      *(undefined1 *)((long)in_RDI + 0x49) = 0;
      *(undefined1 *)((long)in_RDI + 0x4a) = 0;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QToolBarItem_*>::size((QList<QToolBarItem_*> *)(in_RDI + 4));
      QList<QLayoutStruct>::QList
                ((QList<QLayoutStruct> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      local_11c = 0;
      for (local_120 = 0;
          qVar12 = QList<QToolBarItem_*>::size((QList<QToolBarItem_*> *)(in_RDI + 4)),
          local_120 < qVar12; local_120 = local_120 + 1) {
        ppQVar13 = QList<QToolBarItem_*>::at
                             ((QList<QToolBarItem_*> *)
                              CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                              CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        pQVar1 = *ppQVar13;
        local_a0 = &DAT_aaaaaaaaaaaaaaaa;
        iVar6 = (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[4])();
        local_a0 = (undefined1 *)CONCAT44(extraout_var,iVar6);
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        iVar6 = (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[3])();
        local_a8 = (undefined1 *)CONCAT44(extraout_var_00,iVar6);
        local_b0 = &DAT_aaaaaaaaaaaaaaaa;
        iVar6 = (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[2])();
        local_b0 = (undefined1 *)CONCAT44(extraout_var_01,iVar6);
        local_b4 = 0xaaaaaaaa;
        local_b4 = (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[5])();
        uVar7 = (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[8])();
        local_151 = true;
        if ((*(byte *)((long)in_RDI + 0x49) & 1) == 0) {
          local_b8.super_QFlagsStorage<Qt::Orientation>.i =
               (QFlagsStorage<Qt::Orientation>)
               QFlags<Qt::Orientation>::operator&
                         ((QFlags<Qt::Orientation> *)
                          CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe5c);
          IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_b8);
          local_151 = IVar8 != 0;
        }
        *(bool *)((long)in_RDI + 0x49) = local_151;
        iVar6 = (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
        if (CONCAT44(extraout_var_02,iVar6) != 0) {
          (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
          local_bc.bits =
               (Bits)QWidget::sizePolicy((QWidget *)
                                         CONCAT44(in_stack_fffffffffffffe64,
                                                  in_stack_fffffffffffffe60));
          QSizePolicy::horizontalPolicy((QSizePolicy *)&local_bc.bits);
          iVar6 = ::operator&(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
          if (iVar6 != 0) {
            *(undefined1 *)((long)in_RDI + 0x4b) = 1;
          }
        }
        if ((uVar7 & 1) == 0) {
          if (local_11c == 0) {
            iVar6 = pick(in_stack_fffffffffffffe64,
                         (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
            piVar11 = rpick(in_stack_fffffffffffffe64,
                            (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
            *piVar11 = iVar6 + *piVar11;
          }
          local_c0 = perp(in_stack_fffffffffffffe64,
                          (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          local_c4 = perp(in_stack_fffffffffffffe64,
                          (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          piVar11 = qMax<int>(&local_c0,&local_c4);
          iVar6 = *piVar11;
          piVar11 = rperp(in_stack_fffffffffffffe64,
                          (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          *piVar11 = iVar6;
          local_160 = iVar3;
          if (local_11c == 0) {
            local_160 = 0;
          }
          iVar6 = pick(in_stack_fffffffffffffe64,
                       (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          piVar11 = rpick(in_stack_fffffffffffffe64,
                          (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          *piVar11 = local_160 + iVar6 + *piVar11;
          local_c0 = perp(in_stack_fffffffffffffe64,
                          (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          local_c8 = perp(in_stack_fffffffffffffe64,
                          (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          piVar11 = qMax<int>(&local_c0,&local_c8);
          iVar6 = *piVar11;
          piVar11 = rperp(in_stack_fffffffffffffe64,
                          (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          *piVar11 = iVar6;
          local_11c = local_11c + 1;
        }
        iVar6 = pick(in_stack_fffffffffffffe64,
                     (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        pQVar14 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        pQVar14->sizeHint = iVar6;
        iVar6 = pick(in_stack_fffffffffffffe64,
                     (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        pQVar14 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        pQVar14->maximumSize = iVar6;
        iVar6 = pick(in_stack_fffffffffffffe64,
                     (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        pQVar14 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        pQVar14->minimumSize = iVar6;
        local_cc.super_QFlagsStorage<Qt::Orientation>.i =
             (QFlagsStorage<Qt::Orientation>)
             QFlags<Qt::Orientation>::operator&
                       ((QFlags<Qt::Orientation> *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c);
        IVar8 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_cc);
        pQVar14 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        pQVar14->expansive = IVar8 != 0;
        if (OVar5 == Horizontal) {
          (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
          local_d0.bits =
               (Bits)QWidget::sizePolicy((QWidget *)
                                         CONCAT44(in_stack_fffffffffffffe64,
                                                  in_stack_fffffffffffffe60));
          iVar6 = QSizePolicy::horizontalStretch((QSizePolicy *)&local_d0.bits);
          pQVar14 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          pQVar14->stretch = iVar6;
        }
        else {
          (*(pQVar1->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
          local_d4.bits =
               (Bits)QWidget::sizePolicy((QWidget *)
                                         CONCAT44(in_stack_fffffffffffffe64,
                                                  in_stack_fffffffffffffe60));
          iVar6 = QSizePolicy::verticalStretch((QSizePolicy *)&local_d4.bits);
          pQVar14 = QList<QLayoutStruct>::operator[]
                              ((QList<QLayoutStruct> *)
                               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          pQVar14->stretch = iVar6;
        }
        pQVar14 = QList<QLayoutStruct>::operator[]
                            ((QList<QLayoutStruct> *)
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        pQVar14->empty = (bool)((byte)uVar7 & 1);
      }
      QList<QLayoutStruct>::operator=
                ((QList<QLayoutStruct> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (QList<QLayoutStruct> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      *(bool *)((long)in_RDI + 0x4a) = local_11c == 0;
      OVar5 = local_13c;
      piVar11 = rpick(in_stack_fffffffffffffe64,
                      (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      *piVar11 = OVar5 + *piVar11;
      OVar5 = pick(in_stack_fffffffffffffe74,
                   (QMargins *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      pick(OVar5,(QMargins *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
      QSize::operator+=((QSize *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      qVar12 = QList<QToolBarItem_*>::size((QList<QToolBarItem_*> *)(in_RDI + 4));
      if (1 < qVar12) {
        in_stack_fffffffffffffe6c = iVar3 + iVar4;
        piVar11 = rpick(in_stack_fffffffffffffe64,
                        (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        *piVar11 = in_stack_fffffffffffffe6c + *piVar11;
      }
      piVar11 = rpick(local_13c,
                      (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      *piVar11 = local_13c + *piVar11;
      iVar3 = pick(OVar5,(QMargins *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      pick(OVar5,(QMargins *)CONCAT44(in_stack_fffffffffffffe6c,iVar3));
      QSize::QSize((QSize *)CONCAT44(local_13c,in_stack_fffffffffffffe60),in_stack_fffffffffffffe5c,
                   in_stack_fffffffffffffe58);
      QSize::operator+=((QSize *)CONCAT44(local_13c,in_stack_fffffffffffffe60),
                        (QSize *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      *(undefined1 *)(in_RDI + 9) = 0;
      QList<QLayoutStruct>::~QList((QList<QLayoutStruct> *)0x6fdb22);
      QStyleOptionToolBar::~QStyleOptionToolBar((QStyleOptionToolBar *)0x6fdb2f);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarLayout::updateGeomArray() const
{
    if (!dirty)
        return;

    QToolBarLayout *that = const_cast<QToolBarLayout*>(this);

    QToolBar *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    QStyle *style = tb->style();
    QStyleOptionToolBar opt;
    tb->initStyleOption(&opt);
    const int handleExtent = movable()
            ? style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb) : 0;
    const QMargins margins = contentsMargins();
    const int spacing = this->spacing();
    const int extensionExtent = style->pixelMetric(QStyle::PM_ToolBarExtensionExtent, &opt, tb);
    Qt::Orientation o = tb->orientation();

    that->minSize = QSize(0, 0);
    that->hint = QSize(0, 0);
    rperp(o, that->minSize) = style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb);
    rperp(o, that->hint) = style->pixelMetric(QStyle::PM_ToolBarHandleExtent, &opt, tb);

    that->expanding = false;
    that->empty = false;

    QList<QLayoutStruct> a(items.size() + 1); // + 1 for the stretch

    int count = 0;
    for (int i = 0; i < items.size(); ++i) {
        QToolBarItem *item = items.at(i);

        QSize max = item->maximumSize();
        QSize min = item->minimumSize();
        QSize hint = item->sizeHint();
        Qt::Orientations exp = item->expandingDirections();
        bool empty = item->isEmpty();

        that->expanding = expanding || exp & o;


        if (item->widget()) {
            if ((item->widget()->sizePolicy().horizontalPolicy() & QSizePolicy::ExpandFlag)) {
                that->expandFlag = true;
            }
        }

        if (!empty) {
            if (count == 0) // the minimum size only displays one widget
                rpick(o, that->minSize) += pick(o, min);
            int s = perp(o, minSize);
            rperp(o, that->minSize) = qMax(s, perp(o, min));

            //we only add spacing before item (ie never before the first one)
            rpick(o, that->hint) += (count == 0 ? 0 : spacing) + pick(o, hint);
            s = perp(o, that->hint);
            rperp(o, that->hint) = qMax(s, perp(o, hint));
            ++count;
        }

        a[i].sizeHint = pick(o, hint);
        a[i].maximumSize = pick(o, max);
        a[i].minimumSize = pick(o, min);
        a[i].expansive = exp & o;
        if (o == Qt::Horizontal)
            a[i].stretch = item->widget()->sizePolicy().horizontalStretch();
        else
            a[i].stretch = item->widget()->sizePolicy().verticalStretch();
        a[i].empty = empty;
    }

    that->geomArray = a;
    that->empty = count == 0;

    rpick(o, that->minSize) += handleExtent;
    that->minSize += QSize(pick(Qt::Horizontal, margins), pick(Qt::Vertical, margins));
    if (items.size() > 1)
        rpick(o, that->minSize) += spacing + extensionExtent;

    rpick(o, that->hint) += handleExtent;
    that->hint += QSize(pick(Qt::Horizontal, margins), pick(Qt::Vertical, margins));
    that->dirty = false;
}